

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O2

void __thiscall
HSimplexNla::reportArray
          (HSimplexNla *this,string *message,HighsInt offset,HVector *vector,bool force)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  string local_50;
  
  if ((this->report_ | force) == 1) {
    uVar1 = this->lp_->num_row_;
    if ((int)uVar1 < 0x1a) {
      printf("%s",(message->_M_dataplus)._M_p);
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = 0;
      }
      uVar2 = 0;
      while( true ) {
        if (uVar3 == uVar2) break;
        if ((uVar2 != 0) && ((int)((uVar2 & 0xffffffff) / 10) * -10 + (int)uVar2 == 0)) {
          printf("\n                                 ");
        }
        printf("%11.4g ",
               (vector->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar2]);
        uVar2 = uVar2 + 1;
      }
      putchar(10);
      return;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)message);
    reportArraySparse(this,&local_50,offset,vector,force);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void HSimplexNla::reportArray(const std::string message, const HighsInt offset,
                              const HVector* vector, const bool force) const {
  if (!report_ && !force) return;
  const HighsInt num_row = lp_->num_row_;
  if (num_row > kReportItemLimit) {
    reportArraySparse(message, offset, vector, force);
  } else {
    printf("%s", message.c_str());
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (iRow > 0 && iRow % 10 == 0)
        printf("\n                                 ");
      printf("%11.4g ", vector->array[iRow]);
    }
    printf("\n");
  }
}